

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::ParseVectorDataArray
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *out,Element *el)

{
  pointer *ppaVar1;
  Token *t;
  pointer ppTVar2;
  iterator iVar3;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  uint uVar5;
  ulong __n_00;
  pointer ppTVar6;
  double *pdVar7;
  float *pfVar8;
  float fVar9;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_79;
  undefined1 local_78 [8];
  pointer pcStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  aiVector3t<float> local_50;
  char *local_40;
  uint local_34;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(out,0);
  ppTVar6 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_78 = (undefined1  [8])&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"unexpected empty element","");
    anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
  }
  t = *ppTVar6;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_79,&local_34,el);
    if (0x55555555 < local_34 * -0x55555555) {
      local_78 = (undefined1  [8])&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"number of floats is not a multiple of three (3) (binary)","");
      anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
    }
    if (local_34 != 0) {
      if ((local_79 & 0xfd) != 100) {
        local_78 = (undefined1  [8])&local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"expected float or double array (binary)","");
        anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
      }
      local_78 = (undefined1  [8])0x0;
      pcStack_70 = (pointer)0x0;
      local_68._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_79,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)local_78,
                 in_R9);
      __n_00 = (ulong)local_34 / 3;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(out,__n_00);
      if (local_79 == 0x66) {
        if (2 < local_34) {
          pfVar8 = (float *)((long)local_78 + 8);
          do {
            local_50.z = *pfVar8;
            local_50.x = pfVar8[-2];
            local_50.y = pfVar8[-1];
            iVar3._M_current =
                 (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)out,iVar3,
                         &local_50);
            }
            else {
              (iVar3._M_current)->z = local_50.z;
              (iVar3._M_current)->x = local_50.x;
              (iVar3._M_current)->y = local_50.y;
              ppaVar1 = &(out->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            pfVar8 = pfVar8 + 3;
            uVar5 = (int)__n_00 - 1;
            __n_00 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
      }
      else if ((local_79 == 100) && (2 < local_34)) {
        pdVar7 = (double *)((long)local_78 + 0x10);
        do {
          local_50.z = (float)*pdVar7;
          local_50.x = (float)pdVar7[-2];
          local_50.y = (float)pdVar7[-1];
          iVar3._M_current =
               (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)out,iVar3,
                       &local_50);
          }
          else {
            (iVar3._M_current)->z = local_50.z;
            (iVar3._M_current)->x = local_50.x;
            (iVar3._M_current)->y = local_50.y;
            ppaVar1 = &(out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          pdVar7 = pdVar7 + 3;
          uVar5 = (int)__n_00 - 1;
          __n_00 = (ulong)uVar5;
        } while (uVar5 != 0);
      }
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    local_78 = (undefined1  [8])&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a","");
    pEVar4 = GetRequiredElement(sc,(string *)local_78,el);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
    ppTVar6 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (0x5555555555555555 < (ulong)(((long)ppTVar2 - (long)ppTVar6 >> 3) * -0x5555555555555555)) {
      local_78 = (undefined1  [8])&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"number of floats is not a multiple of three (3)","");
      anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
    }
    if (ppTVar6 != ppTVar2) {
      do {
        local_78 = (undefined1  [8])0x0;
        pcStack_70 = (pointer)((ulong)pcStack_70 & 0xffffffff00000000);
        fVar9 = ParseTokenAsFloat(*ppTVar6);
        local_78._0_4_ = fVar9;
        fVar9 = ParseTokenAsFloat(ppTVar6[1]);
        local_78._4_4_ = fVar9;
        fVar9 = ParseTokenAsFloat(ppTVar6[2]);
        pcStack_70 = (pointer)CONCAT44(pcStack_70._4_4_,fVar9);
        iVar3._M_current =
             (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)out,iVar3,
                     (aiVector3t<float> *)local_78);
        }
        else {
          (iVar3._M_current)->z = fVar9;
          (iVar3._M_current)->x = (float)local_78._0_4_;
          (iVar3._M_current)->y = (float)local_78._4_4_;
          ppaVar1 = &(out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        ppTVar6 = ppTVar6 + 3;
      } while (ppTVar6 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiVector3D>& out, const Element& el)
{
    out.resize( 0 );

    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 3 != 0) {
            ParseError("number of floats is not a multiple of three (3) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count3 = count / 3;
        out.reserve(count3);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count3; ++i, d += 3) {
                out.push_back(aiVector3D(static_cast<ai_real>(d[0]),
                    static_cast<ai_real>(d[1]),
                    static_cast<ai_real>(d[2])));
            }
            // for debugging
            /*for ( size_t i = 0; i < out.size(); i++ ) {
                aiVector3D vec3( out[ i ] );
                std::stringstream stream;
                stream << " vec3.x = " << vec3.x << " vec3.y = " << vec3.y << " vec3.z = " << vec3.z << std::endl;
                DefaultLogger::get()->info( stream.str() );
            }*/
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count3; ++i, f += 3) {
                out.push_back(aiVector3D(f[0],f[1],f[2]));
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // may throw bad_alloc if the input is rubbish, but this need
    // not to be prevented - importing would fail but we wouldn't
    // crash since assimp handles this case properly.
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 3 != 0) {
        ParseError("number of floats is not a multiple of three (3)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiVector3D v;
        v.x = ParseTokenAsFloat(**it++);
        v.y = ParseTokenAsFloat(**it++);
        v.z = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}